

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  clock_t cVar1;
  ostream *poVar2;
  clock_t cVar3;
  stringstream ss;
  stringstream local_1a0 [128];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  create_files((stringstream *)local_1a0);
  cVar1 = clock();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_228b,0x3e)
  ;
  one_thread();
  poVar2 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  cVar3 = clock();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_22ae,0x5c)
  ;
  poVar2 = std::ostream::_M_insert<double>((double)(uint)((int)cVar3 - (int)cVar1) / 1000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  cVar1 = clock();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_22c4,0x25)
  ;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,anon_var_dwarf_22ec,0x11);
  more_pthr();
  poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  cVar3 = clock();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,anon_var_dwarf_2302,0x5a);
  poVar2 = std::ostream::_M_insert<double>((double)(uint)((int)cVar3 - (int)cVar1) / 1000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return 0;
}

Assistant:

int main() {
    stringstream ss;

    //генерация случайных файлов
    create_files(ss);
    //

    unsigned int time_begin = clock();
    cout << "Сумма высчитанная в одном потоке: " << one_thread() << endl;
    unsigned int time_end = clock();
    cout << "Один поток посчитал сумму чисел во всех файлах за: " << (time_end - time_begin) / 1000.0 << endl;
    time_begin = clock();
    cout << "Сумма высчитанная в " << N << " потоках: " << more_pthr() << endl;
    time_end = clock();
    cout << N << " потоков посчитали сумму чисел во всех файлах за: " << (time_end - time_begin) / 1000.0 << endl;
    return 0;
}